

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx512::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  NodeRef root;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t k;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  char cVar25;
  byte bVar26;
  byte bVar27;
  size_t mask;
  ulong uVar28;
  undefined4 uVar29;
  long lVar30;
  ulong *puVar31;
  uint uVar32;
  undefined1 (*pauVar33) [32];
  bool bVar34;
  byte bVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar39 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar40 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar57;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 in_ZMM1 [64];
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar73 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 in_ZMM4 [64];
  float fVar84;
  float fVar90;
  undefined1 auVar85 [16];
  undefined1 auVar87 [32];
  undefined1 auVar89 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  vfloat4 a0;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2980;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined4 uStack_28c4;
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  undefined4 uStack_28a4;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  int iVar38;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar88 [64];
  undefined1 auVar86 [32];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar46 = *(undefined1 (*) [32])(ray + 0x100);
    auVar42 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar36 = vcmpps_avx512vl(auVar46,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar28 = vpcmpeqd_avx512vl(auVar42,(undefined1  [32])valid_i->field_0);
    uVar36 = uVar36 & uVar28;
    bVar35 = (byte)uVar36;
    if (bVar35 != 0) {
      local_2920 = *(undefined1 (*) [32])(ray + 0x80);
      local_2900 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_28e0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar88._0_4_ = local_28e0._0_4_ * local_28e0._0_4_;
      auVar88._4_4_ = local_28e0._4_4_ * local_28e0._4_4_;
      auVar88._8_4_ = local_28e0._8_4_ * local_28e0._8_4_;
      auVar88._12_4_ = local_28e0._12_4_ * local_28e0._12_4_;
      auVar88._16_4_ = local_28e0._16_4_ * local_28e0._16_4_;
      auVar88._20_4_ = local_28e0._20_4_ * local_28e0._20_4_;
      auVar88._28_36_ = in_ZMM4._28_36_;
      auVar88._24_4_ = local_28e0._24_4_ * local_28e0._24_4_;
      auVar91 = vfmadd231ps_fma(auVar88._0_32_,local_2900,local_2900);
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_2920,local_2920);
      auVar41 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
      auVar42._8_4_ = 0xbf000000;
      auVar42._0_8_ = 0xbf000000bf000000;
      auVar42._12_4_ = 0xbf000000;
      auVar42._16_4_ = 0xbf000000;
      auVar42._20_4_ = 0xbf000000;
      auVar42._24_4_ = 0xbf000000;
      auVar42._28_4_ = 0xbf000000;
      auVar42 = vmulps_avx512vl(ZEXT1632(auVar91),auVar42);
      fVar84 = auVar41._0_4_;
      fVar90 = auVar41._4_4_;
      fVar57 = auVar41._8_4_;
      fVar64 = auVar41._12_4_;
      fVar65 = auVar41._16_4_;
      fVar66 = auVar41._20_4_;
      fVar67 = auVar41._24_4_;
      auVar91._0_4_ = fVar84 * fVar84;
      auVar91._4_4_ = fVar90 * fVar90;
      auVar91._8_4_ = fVar57 * fVar57;
      auVar91._12_4_ = fVar64 * fVar64;
      auVar44._4_4_ = auVar91._4_4_ * fVar90 * auVar42._4_4_;
      auVar44._0_4_ = auVar91._0_4_ * fVar84 * auVar42._0_4_;
      auVar44._8_4_ = auVar91._8_4_ * fVar57 * auVar42._8_4_;
      auVar44._12_4_ = auVar91._12_4_ * fVar64 * auVar42._12_4_;
      auVar44._16_4_ = fVar65 * fVar65 * fVar65 * auVar42._16_4_;
      auVar44._20_4_ = fVar66 * fVar66 * fVar66 * auVar42._20_4_;
      auVar44._24_4_ = fVar67 * fVar67 * fVar67 * auVar42._24_4_;
      auVar44._28_4_ = auVar42._28_4_;
      auVar43._8_4_ = 0x3fc00000;
      auVar43._0_8_ = 0x3fc000003fc00000;
      auVar43._12_4_ = 0x3fc00000;
      auVar43._16_4_ = 0x3fc00000;
      auVar43._20_4_ = 0x3fc00000;
      auVar43._24_4_ = 0x3fc00000;
      auVar43._28_4_ = 0x3fc00000;
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar44,auVar41,auVar43);
      auVar82._8_4_ = 0x80000000;
      auVar82._0_8_ = 0x8000000080000000;
      auVar82._12_4_ = 0x80000000;
      auVar85._12_4_ = 0;
      auVar85._0_12_ = ZEXT812(0);
      auVar85 = auVar85 << 0x20;
      auVar88 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar91 = vpcmpeqd_avx(auVar91,auVar91);
      auVar94 = ZEXT464(0x3fc00000);
      auVar95 = ZEXT464(0x3f000000);
      uVar28 = uVar36;
      do {
        lVar30 = 0;
        for (uVar37 = uVar28; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar37 = (ulong)(uint)((int)lVar30 * 4);
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar37 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar37 + 0xa0)),0x1c);
        fVar84 = *(float *)((long)&local_27c0 + uVar37);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + uVar37 + 0xc0)),0x28);
        auVar97._0_4_ = auVar39._0_4_ * fVar84;
        auVar97._4_4_ = auVar39._4_4_ * fVar84;
        auVar97._8_4_ = auVar39._8_4_ * fVar84;
        auVar97._12_4_ = auVar39._12_4_ * fVar84;
        auVar39 = vshufpd_avx(auVar97,auVar97,1);
        auVar98 = vmovshdup_avx(auVar97);
        auVar100 = vunpckhps_avx(auVar97,auVar85);
        auVar40._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
        auVar40._8_8_ = auVar39._8_8_ ^ auVar82._8_8_;
        auVar40 = vinsertps_avx(auVar40,auVar97,0x2a);
        auVar39 = vdpps_avx(auVar40,auVar40,0x7f);
        auVar100 = vshufps_avx(auVar100,ZEXT416(auVar98._0_4_ ^ 0x80000000),0x41);
        auVar98 = vdpps_avx(auVar100,auVar100,0x7f);
        uVar10 = vcmpps_avx512vl(auVar39,auVar98,1);
        auVar39 = vpmovm2d_avx512vl(uVar10);
        auVar104._0_4_ = auVar39._0_4_;
        auVar104._4_4_ = auVar104._0_4_;
        auVar104._8_4_ = auVar104._0_4_;
        auVar104._12_4_ = auVar104._0_4_;
        uVar37 = vpmovd2m_avx512vl(auVar104);
        auVar39._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar91._4_4_;
        auVar39._0_4_ = (uint)((byte)uVar37 & 1) * auVar91._0_4_;
        auVar39._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar91._8_4_;
        auVar39._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar91._12_4_;
        auVar39 = vblendvps_avx(auVar40,auVar100,auVar39);
        auVar98 = vdpps_avx(auVar39,auVar39,0x7f);
        auVar40 = vrsqrt14ss_avx512f(auVar85,ZEXT416((uint)auVar98._0_4_));
        fVar90 = auVar40._0_4_;
        fVar90 = fVar90 * 1.5 - auVar98._0_4_ * 0.5 * fVar90 * fVar90 * fVar90;
        auVar100._0_4_ = auVar39._0_4_ * fVar90;
        auVar100._4_4_ = auVar39._4_4_ * fVar90;
        auVar100._8_4_ = auVar39._8_4_ * fVar90;
        auVar100._12_4_ = auVar39._12_4_ * fVar90;
        auVar39 = vshufps_avx(auVar100,auVar100,0xc9);
        auVar98 = vshufps_avx(auVar97,auVar97,0xc9);
        auVar105._0_4_ = auVar100._0_4_ * auVar98._0_4_;
        auVar105._4_4_ = auVar100._4_4_ * auVar98._4_4_;
        auVar105._8_4_ = auVar100._8_4_ * auVar98._8_4_;
        auVar105._12_4_ = auVar100._12_4_ * auVar98._12_4_;
        auVar39 = vfmsub231ps_fma(auVar105,auVar97,auVar39);
        lVar30 = lVar30 * 0x30;
        auVar98 = vshufps_avx(auVar39,auVar39,0xc9);
        auVar39 = vdpps_avx(auVar98,auVar98,0x7f);
        uVar28 = uVar28 - 1 & uVar28;
        auVar40 = vrsqrt14ss_avx512f(auVar85,ZEXT416((uint)auVar39._0_4_));
        fVar90 = auVar40._0_4_;
        fVar90 = fVar90 * 1.5 - auVar39._0_4_ * 0.5 * fVar90 * fVar90 * fVar90;
        auVar102._0_4_ = fVar90 * auVar98._0_4_;
        auVar102._4_4_ = fVar90 * auVar98._4_4_;
        auVar102._8_4_ = fVar90 * auVar98._8_4_;
        auVar102._12_4_ = fVar90 * auVar98._12_4_;
        auVar98._0_4_ = fVar84 * auVar97._0_4_;
        auVar98._4_4_ = fVar84 * auVar97._4_4_;
        auVar98._8_4_ = fVar84 * auVar97._8_4_;
        auVar98._12_4_ = fVar84 * auVar97._12_4_;
        auVar40 = vunpcklps_avx(auVar100,auVar98);
        auVar39 = vunpckhps_avx(auVar100,auVar98);
        auVar100 = vunpcklps_avx(auVar102,auVar85);
        auVar98 = vunpckhps_avx(auVar102,auVar85);
        auVar98 = vunpcklps_avx(auVar39,auVar98);
        auVar99 = ZEXT1664(auVar98);
        auVar97 = vunpcklps_avx(auVar40,auVar100);
        auVar39 = vunpckhps_avx(auVar40,auVar100);
        *(undefined1 (*) [16])(local_27a0 + lVar30) = auVar97;
        *(undefined1 (*) [16])(auStack_2790 + lVar30) = auVar39;
        *(undefined1 (*) [16])(auStack_2780 + lVar30) = auVar98;
      } while (uVar28 != 0);
      local_2980._0_8_ = *(undefined8 *)ray;
      local_2980._8_8_ = *(undefined8 *)(ray + 8);
      local_2980._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2980._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2980._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2980._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2980._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2980._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2980._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2980._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2980._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2980._88_8_ = *(undefined8 *)(ray + 0x58);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar106 = ZEXT3264(auVar42);
      vandps_avx512vl(local_2920,auVar42);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar107 = ZEXT3264(auVar43);
      uVar28 = vcmpps_avx512vl(auVar42,auVar43,1);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar108 = ZEXT3264(auVar44);
      auVar41 = vdivps_avx512vl(auVar44,local_2920);
      vandps_avx512vl(local_2900,auVar42);
      uVar37 = vcmpps_avx512vl(auVar41,auVar43,1);
      auVar45 = vdivps_avx512vl(auVar44,local_2900);
      vandps_avx512vl(_local_28e0,auVar42);
      uVar11 = vcmpps_avx512vl(auVar45,auVar43,1);
      auVar42 = vdivps_avx512vl(auVar44,_local_28e0);
      bVar34 = (bool)((byte)uVar28 & 1);
      local_28c0._0_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar41._0_4_;
      bVar34 = (bool)((byte)(uVar28 >> 1) & 1);
      local_28c0._4_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar41._4_4_;
      bVar34 = (bool)((byte)(uVar28 >> 2) & 1);
      fStack_28b8 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar41._8_4_);
      bVar34 = (bool)((byte)(uVar28 >> 3) & 1);
      fStack_28b4 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar41._12_4_);
      bVar34 = (bool)((byte)(uVar28 >> 4) & 1);
      fStack_28b0 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar41._16_4_);
      bVar34 = (bool)((byte)(uVar28 >> 5) & 1);
      fStack_28ac = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar41._20_4_);
      bVar34 = (bool)((byte)(uVar28 >> 6) & 1);
      fStack_28a8 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar41._24_4_);
      bVar34 = SUB81(uVar28 >> 7,0);
      uStack_28a4 = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar41._28_4_;
      bVar34 = (bool)((byte)uVar37 & 1);
      local_28a0._0_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar45._0_4_;
      bVar34 = (bool)((byte)(uVar37 >> 1) & 1);
      local_28a0._4_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar45._4_4_;
      bVar34 = (bool)((byte)(uVar37 >> 2) & 1);
      local_28a0._8_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar45._8_4_;
      bVar34 = (bool)((byte)(uVar37 >> 3) & 1);
      local_28a0._12_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar45._12_4_;
      bVar34 = (bool)((byte)(uVar37 >> 4) & 1);
      local_28a0._16_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar45._16_4_;
      bVar34 = (bool)((byte)(uVar37 >> 5) & 1);
      local_28a0._20_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar45._20_4_;
      bVar34 = (bool)((byte)(uVar37 >> 6) & 1);
      local_28a0._24_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar45._24_4_;
      bVar34 = SUB81(uVar37 >> 7,0);
      local_28a0._28_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar45._28_4_;
      bVar34 = (bool)((byte)uVar11 & 1);
      local_2880._0_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar42._0_4_;
      bVar34 = (bool)((byte)(uVar11 >> 1) & 1);
      local_2880._4_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar42._4_4_;
      bVar34 = (bool)((byte)(uVar11 >> 2) & 1);
      local_2880._8_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar42._8_4_;
      bVar34 = (bool)((byte)(uVar11 >> 3) & 1);
      local_2880._12_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar42._12_4_;
      bVar34 = (bool)((byte)(uVar11 >> 4) & 1);
      local_2880._16_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar42._16_4_;
      bVar34 = (bool)((byte)(uVar11 >> 5) & 1);
      local_2880._20_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar42._20_4_;
      bVar34 = (bool)((byte)(uVar11 >> 6) & 1);
      local_2880._24_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar42._24_4_;
      bVar34 = SUB81(uVar11 >> 7,0);
      local_2880._28_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar42._28_4_;
      uVar28 = vcmpps_avx512vl(_local_28c0,ZEXT832(0) << 0x20,1);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2860._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar42._4_4_;
      local_2860._0_4_ = (uint)((byte)uVar28 & 1) * auVar42._0_4_;
      local_2860._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar42._8_4_;
      local_2860._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar42._12_4_;
      local_2860._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar42._16_4_;
      local_2860._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar42._20_4_;
      local_2860._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar42._24_4_;
      local_2860._28_4_ = (uint)(byte)(uVar28 >> 7) * auVar42._28_4_;
      uVar28 = vcmpps_avx512vl(local_28a0,ZEXT832(0) << 0x20,5);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar34 = (bool)((byte)uVar28 & 1);
      local_2840 = (uint)bVar34 * auVar42._0_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar28 >> 1) & 1);
      uStack_283c = (uint)bVar34 * auVar42._4_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar28 >> 2) & 1);
      uStack_2838 = (uint)bVar34 * auVar42._8_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar28 >> 3) & 1);
      uStack_2834 = (uint)bVar34 * auVar42._12_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar28 >> 4) & 1);
      uStack_2830 = (uint)bVar34 * auVar42._16_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar28 >> 5) & 1);
      uStack_282c = (uint)bVar34 * auVar42._20_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar28 >> 6) & 1);
      uStack_2828 = (uint)bVar34 * auVar42._24_4_ | (uint)!bVar34 * 0x30;
      bVar34 = SUB81(uVar28 >> 7,0);
      uStack_2824 = (uint)bVar34 * auVar42._28_4_ | (uint)!bVar34 * 0x30;
      auVar43 = ZEXT832(0) << 0x20;
      uVar28 = vcmpps_avx512vl(local_2880,auVar43,5);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar34 = (bool)((byte)uVar28 & 1);
      local_2820 = (uint)bVar34 * auVar42._0_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar28 >> 1) & 1);
      uStack_281c = (uint)bVar34 * auVar42._4_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar28 >> 2) & 1);
      uStack_2818 = (uint)bVar34 * auVar42._8_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar28 >> 3) & 1);
      uStack_2814 = (uint)bVar34 * auVar42._12_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar28 >> 4) & 1);
      uStack_2810 = (uint)bVar34 * auVar42._16_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar28 >> 5) & 1);
      uStack_280c = (uint)bVar34 * auVar42._20_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar28 >> 6) & 1);
      uStack_2808 = (uint)bVar34 * auVar42._24_4_ | (uint)!bVar34 * 0x50;
      bVar34 = SUB81(uVar28 >> 7,0);
      uStack_2804 = (uint)bVar34 * auVar42._28_4_ | (uint)!bVar34 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar110 = ZEXT3264(local_1e80);
      auVar42 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar43);
      local_2800._0_4_ =
           (uint)(bVar35 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar35 & 1) * local_1e80._0_4_;
      bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
      local_2800._4_4_ = (uint)bVar34 * auVar42._4_4_ | (uint)!bVar34 * local_1e80._4_4_;
      bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
      local_2800._8_4_ = (uint)bVar34 * auVar42._8_4_ | (uint)!bVar34 * local_1e80._8_4_;
      bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
      local_2800._12_4_ = (uint)bVar34 * auVar42._12_4_ | (uint)!bVar34 * local_1e80._12_4_;
      bVar34 = (bool)((byte)(uVar36 >> 4) & 1);
      local_2800._16_4_ = (uint)bVar34 * auVar42._16_4_ | (uint)!bVar34 * local_1e80._16_4_;
      bVar34 = (bool)((byte)(uVar36 >> 5) & 1);
      local_2800._20_4_ = (uint)bVar34 * auVar42._20_4_ | (uint)!bVar34 * local_1e80._20_4_;
      bVar34 = (bool)((byte)(uVar36 >> 6) & 1);
      local_2800._24_4_ = (uint)bVar34 * auVar42._24_4_ | (uint)!bVar34 * local_1e80._24_4_;
      bVar34 = SUB81(uVar36 >> 7,0);
      local_2800._28_4_ = (uint)bVar34 * auVar42._28_4_ | (uint)!bVar34 * local_1e80._28_4_;
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar109 = ZEXT3264(auVar42);
      auVar46 = vmaxps_avx512vl(auVar46,auVar43);
      local_27e0._0_4_ =
           (uint)(bVar35 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar42._0_4_;
      bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
      local_27e0._4_4_ = (uint)bVar34 * auVar46._4_4_ | (uint)!bVar34 * auVar42._4_4_;
      bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
      local_27e0._8_4_ = (uint)bVar34 * auVar46._8_4_ | (uint)!bVar34 * auVar42._8_4_;
      bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
      local_27e0._12_4_ = (uint)bVar34 * auVar46._12_4_ | (uint)!bVar34 * auVar42._12_4_;
      bVar34 = (bool)((byte)(uVar36 >> 4) & 1);
      local_27e0._16_4_ = (uint)bVar34 * auVar46._16_4_ | (uint)!bVar34 * auVar42._16_4_;
      bVar34 = (bool)((byte)(uVar36 >> 5) & 1);
      local_27e0._20_4_ = (uint)bVar34 * auVar46._20_4_ | (uint)!bVar34 * auVar42._20_4_;
      bVar34 = (bool)((byte)(uVar36 >> 6) & 1);
      local_27e0._24_4_ = (uint)bVar34 * auVar46._24_4_ | (uint)!bVar34 * auVar42._24_4_;
      bVar34 = SUB81(uVar36 >> 7,0);
      local_27e0._28_4_ = (uint)bVar34 * auVar46._28_4_ | (uint)!bVar34 * auVar42._28_4_;
      bVar27 = ~bVar35;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 5;
      }
      else {
        uVar32 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      puVar31 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar33 = (undefined1 (*) [32])local_1e40;
      local_2608 = (bvh->root).ptr;
      local_1e60 = local_2800;
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar111 = ZEXT3264(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar112 = ZEXT3264(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar114 = ZEXT3264(auVar46);
      do {
        pauVar33 = pauVar33 + -1;
        root.ptr = puVar31[-1];
        puVar31 = puVar31 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_007b3f1d:
          iVar38 = 3;
        }
        else {
          auVar46 = *pauVar33;
          uVar36 = vcmpps_avx512vl(auVar46,local_27e0,1);
          if ((char)uVar36 == '\0') {
LAB_007b3f21:
            iVar38 = 2;
          }
          else {
            uVar29 = (undefined4)uVar36;
            iVar38 = 0;
            if ((uint)POPCOUNT(uVar29) <= uVar32) {
              do {
                k = 0;
                for (uVar28 = uVar36; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                auVar88 = ZEXT1664(auVar88._0_16_);
                auVar94 = ZEXT1664(auVar94._0_16_);
                auVar95 = ZEXT1664(auVar95._0_16_);
                auVar99 = ZEXT1664(auVar99._0_16_);
                bVar34 = occluded1(This,bvh,root,k,(Precalculations *)&local_27c0,ray,
                                   (TravRayK<8,_true> *)&local_2980.field_0,context);
                bVar26 = (byte)(1 << ((uint)k & 0x1f));
                if (!bVar34) {
                  bVar26 = 0;
                }
                bVar27 = bVar27 | bVar26;
                uVar36 = uVar36 - 1 & uVar36;
              } while (uVar36 != 0);
              if (bVar27 == 0xff) {
                iVar38 = 3;
              }
              else {
                auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                local_27e0._0_4_ =
                     (uint)(bVar27 & 1) * auVar42._0_4_ |
                     (uint)!(bool)(bVar27 & 1) * local_27e0._0_4_;
                bVar34 = (bool)(bVar27 >> 1 & 1);
                local_27e0._4_4_ = (uint)bVar34 * auVar42._4_4_ | (uint)!bVar34 * local_27e0._4_4_;
                bVar34 = (bool)(bVar27 >> 2 & 1);
                local_27e0._8_4_ = (uint)bVar34 * auVar42._8_4_ | (uint)!bVar34 * local_27e0._8_4_;
                bVar34 = (bool)(bVar27 >> 3 & 1);
                local_27e0._12_4_ =
                     (uint)bVar34 * auVar42._12_4_ | (uint)!bVar34 * local_27e0._12_4_;
                bVar34 = (bool)(bVar27 >> 4 & 1);
                local_27e0._16_4_ =
                     (uint)bVar34 * auVar42._16_4_ | (uint)!bVar34 * local_27e0._16_4_;
                bVar34 = (bool)(bVar27 >> 5 & 1);
                local_27e0._20_4_ =
                     (uint)bVar34 * auVar42._20_4_ | (uint)!bVar34 * local_27e0._20_4_;
                bVar34 = (bool)(bVar27 >> 6 & 1);
                local_27e0._24_4_ =
                     (uint)bVar34 * auVar42._24_4_ | (uint)!bVar34 * local_27e0._24_4_;
                local_27e0._28_4_ =
                     (uint)(bVar27 >> 7) * auVar42._28_4_ |
                     (uint)!(bool)(bVar27 >> 7) * local_27e0._28_4_;
                iVar38 = 2;
              }
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar106 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar107 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar108 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar109 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar110 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar111 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar112 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar114 = ZEXT3264(auVar42);
            }
            if (uVar32 < (uint)POPCOUNT(uVar29)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_007b3f1d;
                  uVar10 = vcmpps_avx512vl(auVar46,local_27e0,9);
                  if ((char)uVar10 != '\0') {
                    if (bVar27 == 0xff) {
                      bVar26 = 0;
                    }
                    else {
                      uVar36 = (ulong)(byte)~bVar27;
                      bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar2 = This->leafIntersector;
                      bVar26 = 0;
                      do {
                        lVar30 = 0;
                        for (uVar28 = uVar36; (uVar28 & 1) == 0;
                            uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                          lVar30 = lVar30 + 1;
                        }
                        auVar88 = ZEXT1664(auVar88._0_16_);
                        auVar94 = ZEXT1664(auVar94._0_16_);
                        auVar95 = ZEXT1664(auVar95._0_16_);
                        auVar99 = ZEXT1664(auVar99._0_16_);
                        cVar25 = (**(code **)((long)pvVar2 + (ulong)bVar1 * 0x40 + 0x28))
                                           (&local_27c0,ray,lVar30,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        bVar18 = (byte)(1 << ((uint)lVar30 & 0x1f));
                        if (cVar25 == '\0') {
                          bVar18 = 0;
                        }
                        bVar26 = bVar26 | bVar18;
                        uVar36 = uVar36 - 1 & uVar36;
                      } while (uVar36 != 0);
                    }
                    bVar27 = bVar27 | bVar26;
                    if (bVar27 == 0xff) {
                      iVar38 = 3;
                    }
                    else {
                      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      local_27e0._0_4_ =
                           (uint)(bVar27 & 1) * auVar46._0_4_ |
                           (uint)!(bool)(bVar27 & 1) * local_27e0._0_4_;
                      bVar34 = (bool)(bVar27 >> 1 & 1);
                      local_27e0._4_4_ =
                           (uint)bVar34 * auVar46._4_4_ | (uint)!bVar34 * local_27e0._4_4_;
                      bVar34 = (bool)(bVar27 >> 2 & 1);
                      local_27e0._8_4_ =
                           (uint)bVar34 * auVar46._8_4_ | (uint)!bVar34 * local_27e0._8_4_;
                      bVar34 = (bool)(bVar27 >> 3 & 1);
                      local_27e0._12_4_ =
                           (uint)bVar34 * auVar46._12_4_ | (uint)!bVar34 * local_27e0._12_4_;
                      bVar34 = (bool)(bVar27 >> 4 & 1);
                      local_27e0._16_4_ =
                           (uint)bVar34 * auVar46._16_4_ | (uint)!bVar34 * local_27e0._16_4_;
                      bVar34 = (bool)(bVar27 >> 5 & 1);
                      local_27e0._20_4_ =
                           (uint)bVar34 * auVar46._20_4_ | (uint)!bVar34 * local_27e0._20_4_;
                      bVar34 = (bool)(bVar27 >> 6 & 1);
                      local_27e0._24_4_ =
                           (uint)bVar34 * auVar46._24_4_ | (uint)!bVar34 * local_27e0._24_4_;
                      local_27e0._28_4_ =
                           (uint)(bVar27 >> 7) * auVar46._28_4_ |
                           (uint)!(bool)(bVar27 >> 7) * local_27e0._28_4_;
                      iVar38 = 0;
                    }
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar106 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar107 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar108 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar109 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar110 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar111 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar112 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar114 = ZEXT3264(auVar46);
                    break;
                  }
                  goto LAB_007b3f21;
                }
                uVar37 = root.ptr & 0xfffffffffffffff0;
                auVar115 = ZEXT3264(auVar110._0_32_);
                uVar36 = 0;
                uVar28 = 8;
                do {
                  uVar11 = *(ulong *)(uVar37 + uVar36 * 8);
                  if (uVar11 != 8) {
                    auVar89._28_36_ = auVar88._28_36_;
                    if ((root.ptr & 7) == 0) {
                      uVar29 = *(undefined4 *)(root.ptr + 0x20 + uVar36 * 4);
                      auVar58._4_4_ = uVar29;
                      auVar58._0_4_ = uVar29;
                      auVar58._8_4_ = uVar29;
                      auVar58._12_4_ = uVar29;
                      auVar58._16_4_ = uVar29;
                      auVar58._20_4_ = uVar29;
                      auVar58._24_4_ = uVar29;
                      auVar58._28_4_ = uVar29;
                      auVar19._8_8_ = local_2980._8_8_;
                      auVar19._0_8_ = local_2980._0_8_;
                      auVar19._16_8_ = local_2980._16_8_;
                      auVar19._24_8_ = local_2980._24_8_;
                      auVar21._8_8_ = local_2980._40_8_;
                      auVar21._0_8_ = local_2980._32_8_;
                      auVar21._16_8_ = local_2980._48_8_;
                      auVar21._24_8_ = local_2980._56_8_;
                      auVar23._8_8_ = local_2980._72_8_;
                      auVar23._0_8_ = local_2980._64_8_;
                      auVar23._16_8_ = local_2980._80_8_;
                      auVar23._24_8_ = local_2980._88_8_;
                      auVar46 = vsubps_avx(auVar58,auVar19);
                      auVar89._0_4_ = (float)local_28c0._0_4_ * auVar46._0_4_;
                      auVar89._4_4_ = (float)local_28c0._4_4_ * auVar46._4_4_;
                      auVar89._8_4_ = fStack_28b8 * auVar46._8_4_;
                      auVar89._12_4_ = fStack_28b4 * auVar46._12_4_;
                      auVar89._16_4_ = fStack_28b0 * auVar46._16_4_;
                      auVar89._20_4_ = fStack_28ac * auVar46._20_4_;
                      auVar89._24_4_ = fStack_28a8 * auVar46._24_4_;
                      auVar86 = auVar89._0_32_;
                      uVar29 = *(undefined4 *)(root.ptr + 0x40 + uVar36 * 4);
                      auVar59._4_4_ = uVar29;
                      auVar59._0_4_ = uVar29;
                      auVar59._8_4_ = uVar29;
                      auVar59._12_4_ = uVar29;
                      auVar59._16_4_ = uVar29;
                      auVar59._20_4_ = uVar29;
                      auVar59._24_4_ = uVar29;
                      auVar59._28_4_ = uVar29;
                      auVar46 = vsubps_avx(auVar59,auVar21);
                      auVar94._0_4_ = local_28a0._0_4_ * auVar46._0_4_;
                      auVar94._4_4_ = local_28a0._4_4_ * auVar46._4_4_;
                      auVar94._8_4_ = local_28a0._8_4_ * auVar46._8_4_;
                      auVar94._12_4_ = local_28a0._12_4_ * auVar46._12_4_;
                      auVar94._16_4_ = local_28a0._16_4_ * auVar46._16_4_;
                      auVar94._20_4_ = local_28a0._20_4_ * auVar46._20_4_;
                      auVar94._24_4_ = local_28a0._24_4_ * auVar46._24_4_;
                      auVar44 = auVar94._0_32_;
                      uVar29 = *(undefined4 *)(root.ptr + 0x60 + uVar36 * 4);
                      auVar60._4_4_ = uVar29;
                      auVar60._0_4_ = uVar29;
                      auVar60._8_4_ = uVar29;
                      auVar60._12_4_ = uVar29;
                      auVar60._16_4_ = uVar29;
                      auVar60._20_4_ = uVar29;
                      auVar60._24_4_ = uVar29;
                      auVar60._28_4_ = uVar29;
                      auVar46 = vsubps_avx(auVar60,auVar23);
                      auVar95 = ZEXT3264(local_2880);
                      auVar99._0_4_ = local_2880._0_4_ * auVar46._0_4_;
                      auVar99._4_4_ = local_2880._4_4_ * auVar46._4_4_;
                      auVar99._8_4_ = local_2880._8_4_ * auVar46._8_4_;
                      auVar99._12_4_ = local_2880._12_4_ * auVar46._12_4_;
                      auVar99._16_4_ = local_2880._16_4_ * auVar46._16_4_;
                      auVar99._20_4_ = local_2880._20_4_ * auVar46._20_4_;
                      auVar99._24_4_ = local_2880._24_4_ * auVar46._24_4_;
                      auVar41 = auVar99._0_32_;
                      auVar99 = ZEXT3264(auVar41);
                      uVar29 = *(undefined4 *)(root.ptr + 0x30 + uVar36 * 4);
                      auVar61._4_4_ = uVar29;
                      auVar61._0_4_ = uVar29;
                      auVar61._8_4_ = uVar29;
                      auVar61._12_4_ = uVar29;
                      auVar61._16_4_ = uVar29;
                      auVar61._20_4_ = uVar29;
                      auVar61._24_4_ = uVar29;
                      auVar61._28_4_ = uVar29;
                      auVar46 = vsubps_avx(auVar61,auVar19);
                      uVar29 = *(undefined4 *)(root.ptr + 0x50 + uVar36 * 4);
                      auVar70._4_4_ = uVar29;
                      auVar70._0_4_ = uVar29;
                      auVar70._8_4_ = uVar29;
                      auVar70._12_4_ = uVar29;
                      auVar70._16_4_ = uVar29;
                      auVar70._20_4_ = uVar29;
                      auVar70._24_4_ = uVar29;
                      auVar70._28_4_ = uVar29;
                      auVar13._4_4_ = (float)local_28c0._4_4_ * auVar46._4_4_;
                      auVar13._0_4_ = (float)local_28c0._0_4_ * auVar46._0_4_;
                      auVar13._8_4_ = fStack_28b8 * auVar46._8_4_;
                      auVar13._12_4_ = fStack_28b4 * auVar46._12_4_;
                      auVar13._16_4_ = fStack_28b0 * auVar46._16_4_;
                      auVar13._20_4_ = fStack_28ac * auVar46._20_4_;
                      auVar13._24_4_ = fStack_28a8 * auVar46._24_4_;
                      auVar13._28_4_ = uStack_28a4;
                      auVar46 = vsubps_avx(auVar70,auVar21);
                      auVar14._4_4_ = local_28a0._4_4_ * auVar46._4_4_;
                      auVar14._0_4_ = local_28a0._0_4_ * auVar46._0_4_;
                      auVar14._8_4_ = local_28a0._8_4_ * auVar46._8_4_;
                      auVar14._12_4_ = local_28a0._12_4_ * auVar46._12_4_;
                      auVar14._16_4_ = local_28a0._16_4_ * auVar46._16_4_;
                      auVar14._20_4_ = local_28a0._20_4_ * auVar46._20_4_;
                      auVar14._24_4_ = local_28a0._24_4_ * auVar46._24_4_;
                      auVar14._28_4_ = uVar29;
                      uVar29 = *(undefined4 *)(root.ptr + 0x70 + uVar36 * 4);
                      auVar62._4_4_ = uVar29;
                      auVar62._0_4_ = uVar29;
                      auVar62._8_4_ = uVar29;
                      auVar62._12_4_ = uVar29;
                      auVar62._16_4_ = uVar29;
                      auVar62._20_4_ = uVar29;
                      auVar62._24_4_ = uVar29;
                      auVar62._28_4_ = uVar29;
                      auVar46 = vsubps_avx(auVar62,auVar23);
                      auVar15._4_4_ = local_2880._4_4_ * auVar46._4_4_;
                      auVar15._0_4_ = local_2880._0_4_ * auVar46._0_4_;
                      auVar15._8_4_ = local_2880._8_4_ * auVar46._8_4_;
                      auVar15._12_4_ = local_2880._12_4_ * auVar46._12_4_;
                      auVar15._16_4_ = local_2880._16_4_ * auVar46._16_4_;
                      auVar15._20_4_ = local_2880._20_4_ * auVar46._20_4_;
                      auVar15._24_4_ = local_2880._24_4_ * auVar46._24_4_;
                      auVar15._28_4_ = (int)((ulong)local_2980._56_8_ >> 0x20);
                      auVar46 = vminps_avx(auVar86,auVar13);
                      auVar42 = vminps_avx(auVar44,auVar14);
                      auVar46 = vmaxps_avx(auVar46,auVar42);
                      auVar42 = vminps_avx(auVar41,auVar15);
                      auVar46 = vmaxps_avx(auVar46,auVar42);
                      auVar43 = vmulps_avx512vl(auVar46,auVar111._0_32_);
                      auVar46 = vmaxps_avx(auVar86,auVar13);
                      auVar42 = vmaxps_avx(auVar44,auVar14);
                      auVar42 = vminps_avx(auVar46,auVar42);
                      auVar46 = vmaxps_avx(auVar41,auVar15);
                      auVar46 = vminps_avx(auVar42,auVar46);
                      auVar42 = vmulps_avx512vl(auVar46,auVar112._0_32_);
                      auVar46 = vmaxps_avx(auVar43,local_2800);
                      auVar42 = vminps_avx(auVar42,local_27e0);
                    }
                    else {
                      fVar84 = *(float *)(uVar37 + 0x20 + uVar36 * 4);
                      auVar73._4_4_ = fVar84;
                      auVar73._0_4_ = fVar84;
                      auVar73._8_4_ = fVar84;
                      auVar73._12_4_ = fVar84;
                      auVar73._16_4_ = fVar84;
                      auVar73._20_4_ = fVar84;
                      auVar73._24_4_ = fVar84;
                      auVar73._28_4_ = fVar84;
                      uVar29 = *(undefined4 *)(uVar37 + 0x30 + uVar36 * 4);
                      auVar71._4_4_ = uVar29;
                      auVar71._0_4_ = uVar29;
                      auVar71._8_4_ = uVar29;
                      auVar71._12_4_ = uVar29;
                      auVar71._16_4_ = uVar29;
                      auVar71._20_4_ = uVar29;
                      auVar71._24_4_ = uVar29;
                      auVar71._28_4_ = uVar29;
                      fVar90 = *(float *)(uVar37 + 0x40 + uVar36 * 4);
                      auVar63._4_4_ = fVar90;
                      auVar63._0_4_ = fVar90;
                      auVar63._8_4_ = fVar90;
                      auVar63._12_4_ = fVar90;
                      auVar63._16_4_ = fVar90;
                      auVar63._20_4_ = fVar90;
                      auVar63._24_4_ = fVar90;
                      auVar63._28_4_ = fVar90;
                      uVar29 = *(undefined4 *)(uVar37 + 0x50 + uVar36 * 4);
                      auVar103._4_4_ = uVar29;
                      auVar103._0_4_ = uVar29;
                      auVar103._8_4_ = uVar29;
                      auVar103._12_4_ = uVar29;
                      auVar103._16_4_ = uVar29;
                      auVar103._20_4_ = uVar29;
                      auVar103._24_4_ = uVar29;
                      auVar103._28_4_ = uVar29;
                      uVar29 = *(undefined4 *)(uVar37 + 0x60 + uVar36 * 4);
                      auVar101._4_4_ = uVar29;
                      auVar101._0_4_ = uVar29;
                      auVar101._8_4_ = uVar29;
                      auVar101._12_4_ = uVar29;
                      auVar101._16_4_ = uVar29;
                      auVar101._20_4_ = uVar29;
                      auVar101._24_4_ = uVar29;
                      auVar101._28_4_ = uVar29;
                      uVar29 = *(undefined4 *)(uVar37 + 0x70 + uVar36 * 4);
                      auVar93._4_4_ = uVar29;
                      auVar93._0_4_ = uVar29;
                      auVar93._8_4_ = uVar29;
                      auVar93._12_4_ = uVar29;
                      auVar93._16_4_ = uVar29;
                      auVar93._20_4_ = uVar29;
                      auVar93._24_4_ = uVar29;
                      auVar93._28_4_ = uVar29;
                      fVar57 = *(float *)(uVar37 + 0x80 + uVar36 * 4);
                      auVar92._4_4_ = fVar57;
                      auVar92._0_4_ = fVar57;
                      auVar92._8_4_ = fVar57;
                      auVar92._12_4_ = fVar57;
                      auVar92._16_4_ = fVar57;
                      auVar92._20_4_ = fVar57;
                      auVar92._24_4_ = fVar57;
                      auVar92._28_4_ = fVar57;
                      fVar64 = *(float *)(uVar37 + 0x90 + uVar36 * 4);
                      auVar87._4_4_ = fVar64;
                      auVar87._0_4_ = fVar64;
                      auVar87._8_4_ = fVar64;
                      auVar87._12_4_ = fVar64;
                      auVar87._16_4_ = fVar64;
                      auVar87._20_4_ = fVar64;
                      auVar87._24_4_ = fVar64;
                      auVar87._28_4_ = fVar64;
                      fVar65 = *(float *)(uVar37 + 0xa0 + uVar36 * 4);
                      auVar80._4_4_ = fVar65;
                      auVar80._0_4_ = fVar65;
                      auVar80._8_4_ = fVar65;
                      auVar80._12_4_ = fVar65;
                      auVar80._16_4_ = fVar65;
                      auVar80._20_4_ = fVar65;
                      auVar80._24_4_ = fVar65;
                      auVar80._28_4_ = fVar65;
                      auVar20._8_8_ = local_2980._8_8_;
                      auVar20._0_8_ = local_2980._0_8_;
                      auVar20._16_8_ = local_2980._16_8_;
                      auVar20._24_8_ = local_2980._24_8_;
                      auVar22._8_8_ = local_2980._40_8_;
                      auVar22._0_8_ = local_2980._32_8_;
                      auVar22._16_8_ = local_2980._48_8_;
                      auVar22._24_8_ = local_2980._56_8_;
                      auVar24._8_8_ = local_2980._72_8_;
                      auVar24._0_8_ = local_2980._64_8_;
                      auVar24._16_8_ = local_2980._80_8_;
                      auVar24._24_8_ = local_2980._88_8_;
                      auVar96._0_4_ = (float)local_28e0._0_4_ * fVar57;
                      auVar96._4_4_ = (float)local_28e0._4_4_ * fVar57;
                      auVar96._8_4_ = fStack_28d8 * fVar57;
                      auVar96._12_4_ = fStack_28d4 * fVar57;
                      auVar96._16_4_ = fStack_28d0 * fVar57;
                      auVar96._20_4_ = fStack_28cc * fVar57;
                      auVar96._28_36_ = auVar95._28_36_;
                      auVar96._24_4_ = fStack_28c8 * fVar57;
                      auVar95._0_4_ = (float)local_28e0._0_4_ * fVar64;
                      auVar95._4_4_ = (float)local_28e0._4_4_ * fVar64;
                      auVar95._8_4_ = fStack_28d8 * fVar64;
                      auVar95._12_4_ = fStack_28d4 * fVar64;
                      auVar95._16_4_ = fStack_28d0 * fVar64;
                      auVar95._20_4_ = fStack_28cc * fVar64;
                      auVar95._24_4_ = fStack_28c8 * fVar64;
                      auVar95._28_36_ = auVar99._28_36_;
                      auVar113._4_4_ = (float)local_28e0._4_4_ * fVar65;
                      auVar113._0_4_ = (float)local_28e0._0_4_ * fVar65;
                      auVar113._8_4_ = fStack_28d8 * fVar65;
                      auVar113._12_4_ = fStack_28d4 * fVar65;
                      auVar113._16_4_ = fStack_28d0 * fVar65;
                      auVar113._20_4_ = fStack_28cc * fVar65;
                      auVar113._24_4_ = fStack_28c8 * fVar65;
                      auVar113._28_4_ = uStack_28c4;
                      auVar46 = vfmadd231ps_avx512vl(auVar96._0_32_,local_2900,auVar103);
                      auVar42 = vfmadd231ps_avx512vl(auVar95._0_32_,local_2900,auVar101);
                      auVar43 = vfmadd231ps_avx512vl(auVar113,auVar93,local_2900);
                      auVar91 = vfmadd231ps_fma(auVar46,local_2920,auVar73);
                      auVar85 = vfmadd231ps_fma(auVar42,local_2920,auVar71);
                      auVar82 = vfmadd231ps_fma(auVar43,auVar63,local_2920);
                      auVar46 = auVar106._0_32_;
                      vandps_avx512vl(ZEXT1632(auVar91),auVar46);
                      auVar42 = auVar107._0_32_;
                      uVar12 = vcmpps_avx512vl(auVar43,auVar42,1);
                      bVar34 = (bool)((byte)uVar12 & 1);
                      iVar38 = auVar107._0_4_;
                      auVar47._0_4_ = (uint)bVar34 * iVar38 | (uint)!bVar34 * auVar91._0_4_;
                      bVar34 = (bool)((byte)(uVar12 >> 1) & 1);
                      iVar50 = auVar107._4_4_;
                      auVar47._4_4_ = (uint)bVar34 * iVar50 | (uint)!bVar34 * auVar91._4_4_;
                      bVar34 = (bool)((byte)(uVar12 >> 2) & 1);
                      iVar51 = auVar107._8_4_;
                      auVar47._8_4_ = (uint)bVar34 * iVar51 | (uint)!bVar34 * auVar91._8_4_;
                      bVar34 = (bool)((byte)(uVar12 >> 3) & 1);
                      iVar52 = auVar107._12_4_;
                      auVar47._12_4_ = (uint)bVar34 * iVar52 | (uint)!bVar34 * auVar91._12_4_;
                      iVar53 = auVar107._16_4_;
                      auVar47._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * iVar53;
                      iVar54 = auVar107._20_4_;
                      auVar47._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * iVar54;
                      iVar55 = auVar107._24_4_;
                      iVar56 = auVar107._28_4_;
                      auVar47._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * iVar55;
                      auVar47._28_4_ = (uint)(byte)(uVar12 >> 7) * iVar56;
                      vandps_avx512vl(ZEXT1632(auVar85),auVar46);
                      uVar12 = vcmpps_avx512vl(auVar47,auVar42,1);
                      bVar34 = (bool)((byte)uVar12 & 1);
                      auVar48._0_4_ = (uint)bVar34 * iVar38 | (uint)!bVar34 * auVar85._0_4_;
                      bVar34 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar48._4_4_ = (uint)bVar34 * iVar50 | (uint)!bVar34 * auVar85._4_4_;
                      bVar34 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar48._8_4_ = (uint)bVar34 * iVar51 | (uint)!bVar34 * auVar85._8_4_;
                      bVar34 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar48._12_4_ = (uint)bVar34 * iVar52 | (uint)!bVar34 * auVar85._12_4_;
                      auVar48._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * iVar53;
                      auVar48._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * iVar54;
                      auVar48._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * iVar55;
                      auVar48._28_4_ = (uint)(byte)(uVar12 >> 7) * iVar56;
                      vandps_avx512vl(ZEXT1632(auVar82),auVar46);
                      uVar12 = vcmpps_avx512vl(auVar48,auVar42,1);
                      bVar34 = (bool)((byte)uVar12 & 1);
                      auVar49._0_4_ = (uint)bVar34 * iVar38 | (uint)!bVar34 * auVar82._0_4_;
                      bVar34 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar49._4_4_ = (uint)bVar34 * iVar50 | (uint)!bVar34 * auVar82._4_4_;
                      bVar34 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar49._8_4_ = (uint)bVar34 * iVar51 | (uint)!bVar34 * auVar82._8_4_;
                      bVar34 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar49._12_4_ = (uint)bVar34 * iVar52 | (uint)!bVar34 * auVar82._12_4_;
                      auVar49._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * iVar53;
                      auVar49._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * iVar54;
                      auVar49._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * iVar55;
                      auVar49._28_4_ = (uint)(byte)(uVar12 >> 7) * iVar56;
                      auVar46 = vrcp14ps_avx512vl(auVar47);
                      auVar43 = auVar108._0_32_;
                      auVar42 = vfnmadd213ps_avx512vl(auVar47,auVar46,auVar43);
                      auVar91 = vfmadd132ps_fma(auVar42,auVar46,auVar46);
                      auVar95 = ZEXT1664(auVar91);
                      auVar46 = vrcp14ps_avx512vl(auVar48);
                      auVar42 = vfnmadd213ps_avx512vl(auVar48,auVar46,auVar43);
                      auVar85 = vfmadd132ps_fma(auVar42,auVar46,auVar46);
                      auVar99 = ZEXT1664(auVar85);
                      auVar46 = vrcp14ps_avx512vl(auVar49);
                      auVar42 = vfnmadd213ps_avx512vl(auVar49,auVar46,auVar43);
                      auVar82 = vfmadd132ps_fma(auVar42,auVar46,auVar46);
                      auVar113 = auVar114._0_32_;
                      auVar42 = vxorps_avx512vl(ZEXT1632(auVar91),auVar113);
                      auVar43 = vxorps_avx512vl(ZEXT1632(auVar85),auVar113);
                      uVar29 = *(undefined4 *)(uVar37 + 0xb0 + uVar36 * 4);
                      auVar46._4_4_ = uVar29;
                      auVar46._0_4_ = uVar29;
                      auVar46._8_4_ = uVar29;
                      auVar46._12_4_ = uVar29;
                      auVar46._16_4_ = uVar29;
                      auVar46._20_4_ = uVar29;
                      auVar46._24_4_ = uVar29;
                      auVar46._28_4_ = uVar29;
                      auVar46 = vfmadd213ps_avx512vl(auVar92,auVar24,auVar46);
                      uVar29 = *(undefined4 *)(uVar37 + 0xc0 + uVar36 * 4);
                      auVar41._4_4_ = uVar29;
                      auVar41._0_4_ = uVar29;
                      auVar41._8_4_ = uVar29;
                      auVar41._12_4_ = uVar29;
                      auVar41._16_4_ = uVar29;
                      auVar41._20_4_ = uVar29;
                      auVar41._24_4_ = uVar29;
                      auVar41._28_4_ = uVar29;
                      auVar44 = vfmadd213ps_avx512vl(auVar87,auVar24,auVar41);
                      uVar29 = *(undefined4 *)(uVar37 + 0xd0 + uVar36 * 4);
                      auVar45._4_4_ = uVar29;
                      auVar45._0_4_ = uVar29;
                      auVar45._8_4_ = uVar29;
                      auVar45._12_4_ = uVar29;
                      auVar45._16_4_ = uVar29;
                      auVar45._20_4_ = uVar29;
                      auVar45._24_4_ = uVar29;
                      auVar45._28_4_ = uVar29;
                      auVar41 = vfmadd213ps_avx512vl(auVar80,auVar24,auVar45);
                      auVar45 = vxorps_avx512vl(ZEXT1632(auVar82),auVar113);
                      auVar39 = vfmadd231ps_fma(auVar46,auVar22,auVar103);
                      auVar98 = vfmadd231ps_fma(auVar44,auVar22,auVar101);
                      auVar40 = vfmadd231ps_fma(auVar41,auVar22,auVar93);
                      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar20,auVar73);
                      fVar72 = auVar42._0_4_ * auVar39._0_4_;
                      fVar74 = auVar42._4_4_ * auVar39._4_4_;
                      auVar16._4_4_ = fVar74;
                      auVar16._0_4_ = fVar72;
                      fVar75 = auVar42._8_4_ * auVar39._8_4_;
                      auVar16._8_4_ = fVar75;
                      fVar76 = auVar42._12_4_ * auVar39._12_4_;
                      auVar16._12_4_ = fVar76;
                      fVar77 = auVar42._16_4_ * 0.0;
                      auVar16._16_4_ = fVar77;
                      fVar78 = auVar42._20_4_ * 0.0;
                      auVar16._20_4_ = fVar78;
                      fVar79 = auVar42._24_4_ * 0.0;
                      auVar16._24_4_ = fVar79;
                      auVar16._28_4_ = fVar84;
                      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar20,auVar71);
                      auVar43 = vmulps_avx512vl(ZEXT1632(auVar39),auVar43);
                      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar20,auVar63);
                      fVar57 = auVar45._0_4_ * auVar39._0_4_;
                      fVar64 = auVar45._4_4_ * auVar39._4_4_;
                      auVar17._4_4_ = fVar64;
                      auVar17._0_4_ = fVar57;
                      fVar65 = auVar45._8_4_ * auVar39._8_4_;
                      auVar17._8_4_ = fVar65;
                      fVar66 = auVar45._12_4_ * auVar39._12_4_;
                      auVar17._12_4_ = fVar66;
                      fVar67 = auVar45._16_4_ * 0.0;
                      auVar17._16_4_ = fVar67;
                      fVar68 = auVar45._20_4_ * 0.0;
                      auVar17._20_4_ = fVar68;
                      fVar69 = auVar45._24_4_ * 0.0;
                      auVar17._24_4_ = fVar69;
                      auVar17._28_4_ = fVar90;
                      auVar81._0_4_ = auVar91._0_4_ + fVar72;
                      auVar81._4_4_ = auVar91._4_4_ + fVar74;
                      auVar81._8_4_ = auVar91._8_4_ + fVar75;
                      auVar81._12_4_ = auVar91._12_4_ + fVar76;
                      auVar81._16_4_ = fVar77 + 0.0;
                      auVar81._20_4_ = fVar78 + 0.0;
                      auVar81._24_4_ = fVar79 + 0.0;
                      auVar81._28_4_ = fVar84 + 0.0;
                      auVar83._0_4_ = auVar85._0_4_ + auVar43._0_4_;
                      auVar83._4_4_ = auVar85._4_4_ + auVar43._4_4_;
                      auVar83._8_4_ = auVar85._8_4_ + auVar43._8_4_;
                      auVar83._12_4_ = auVar85._12_4_ + auVar43._12_4_;
                      auVar83._16_4_ = auVar43._16_4_ + 0.0;
                      auVar83._20_4_ = auVar43._20_4_ + 0.0;
                      auVar83._24_4_ = auVar43._24_4_ + 0.0;
                      auVar83._28_4_ = auVar43._28_4_ + 0.0;
                      auVar86._0_4_ = auVar82._0_4_ + fVar57;
                      auVar86._4_4_ = auVar82._4_4_ + fVar64;
                      auVar86._8_4_ = auVar82._8_4_ + fVar65;
                      auVar86._12_4_ = auVar82._12_4_ + fVar66;
                      auVar86._16_4_ = fVar67 + 0.0;
                      auVar86._20_4_ = fVar68 + 0.0;
                      auVar86._24_4_ = fVar69 + 0.0;
                      auVar86._28_4_ = fVar90 + 0.0;
                      auVar46 = vpminsd_avx2(auVar16,auVar81);
                      auVar42 = vpminsd_avx2(auVar43,auVar83);
                      auVar46 = vpmaxsd_avx2(auVar46,auVar42);
                      auVar44 = vpminsd_avx2(auVar17,auVar86);
                      auVar46 = vpmaxsd_avx2(auVar46,auVar44);
                      auVar42 = vpmaxsd_avx2(auVar16,auVar81);
                      auVar43 = vpmaxsd_avx2(auVar43,auVar83);
                      auVar43 = vpminsd_avx2(auVar42,auVar43);
                      auVar42 = vpmaxsd_avx2(auVar17,auVar86);
                      auVar42 = vpminsd_avx2(auVar43,auVar42);
                      auVar43 = vmulps_avx512vl(auVar46,auVar111._0_32_);
                      auVar42 = vmulps_avx512vl(auVar42,auVar112._0_32_);
                      auVar46 = vpmaxsd_avx2(auVar43,local_2800);
                      auVar42 = vpminsd_avx2(auVar42,local_27e0);
                    }
                    auVar94 = ZEXT3264(auVar44);
                    auVar88 = ZEXT3264(auVar86);
                    uVar12 = vcmpps_avx512vl(auVar46,auVar42,2);
                    if ((byte)uVar12 != 0) {
                      auVar46 = vblendmps_avx512vl(auVar110._0_32_,auVar43);
                      bVar34 = (bool)((byte)uVar12 & 1);
                      bVar3 = (bool)((byte)(uVar12 >> 1) & 1);
                      bVar4 = (bool)((byte)(uVar12 >> 2) & 1);
                      bVar5 = (bool)((byte)(uVar12 >> 3) & 1);
                      bVar6 = (bool)((byte)(uVar12 >> 4) & 1);
                      bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
                      bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
                      bVar9 = SUB81(uVar12 >> 7,0);
                      if (uVar28 != 8) {
                        *puVar31 = uVar28;
                        puVar31 = puVar31 + 1;
                        *pauVar33 = auVar115._0_32_;
                        pauVar33 = pauVar33 + 1;
                      }
                      auVar115 = ZEXT3264(CONCAT428((uint)bVar9 * auVar46._28_4_ |
                                                    (uint)!bVar9 * auVar43._28_4_,
                                                    CONCAT424((uint)bVar8 * auVar46._24_4_ |
                                                              (uint)!bVar8 * auVar43._24_4_,
                                                              CONCAT420((uint)bVar7 * auVar46._20_4_
                                                                        | (uint)!bVar7 *
                                                                          auVar43._20_4_,
                                                                        CONCAT416((uint)bVar6 *
                                                                                  auVar46._16_4_ |
                                                                                  (uint)!bVar6 *
                                                                                  auVar43._16_4_,
                                                                                  CONCAT412((uint)
                                                  bVar5 * auVar46._12_4_ |
                                                  (uint)!bVar5 * auVar43._12_4_,
                                                  CONCAT48((uint)bVar4 * auVar46._8_4_ |
                                                           (uint)!bVar4 * auVar43._8_4_,
                                                           CONCAT44((uint)bVar3 * auVar46._4_4_ |
                                                                    (uint)!bVar3 * auVar43._4_4_,
                                                                    (uint)bVar34 * auVar46._0_4_ |
                                                                    (uint)!bVar34 * auVar43._0_4_)))
                                                  )))));
                      uVar28 = uVar11;
                    }
                  }
                  auVar46 = auVar115._0_32_;
                } while ((uVar11 != 8) && (bVar34 = uVar36 < 3, uVar36 = uVar36 + 1, bVar34));
                iVar38 = 0;
                if (uVar28 == 8) {
LAB_007b3dad:
                  bVar34 = false;
                  iVar38 = 4;
                }
                else {
                  uVar10 = vcmpps_avx512vl(auVar46,local_27e0,9);
                  bVar34 = true;
                  if ((uint)POPCOUNT((int)uVar10) <= uVar32) {
                    *puVar31 = uVar28;
                    puVar31 = puVar31 + 1;
                    *pauVar33 = auVar46;
                    pauVar33 = pauVar33 + 1;
                    goto LAB_007b3dad;
                  }
                }
                root.ptr = uVar28;
              } while (bVar34);
            }
          }
        }
      } while (iVar38 != 3);
      bVar27 = bVar27 & bVar35;
      bVar34 = (bool)(bVar27 >> 1 & 1);
      bVar3 = (bool)(bVar27 >> 2 & 1);
      bVar4 = (bool)(bVar27 >> 3 & 1);
      bVar5 = (bool)(bVar27 >> 4 & 1);
      bVar6 = (bool)(bVar27 >> 5 & 1);
      bVar7 = (bool)(bVar27 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(bVar27 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar27 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar34 * auVar109._4_4_ | (uint)!bVar34 * *(int *)(ray + 0x104)
      ;
      *(uint *)(ray + 0x108) = (uint)bVar3 * auVar109._8_4_ | (uint)!bVar3 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar4 * auVar109._12_4_ | (uint)!bVar4 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar5 * auVar109._16_4_ | (uint)!bVar5 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar6 * auVar109._20_4_ | (uint)!bVar6 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar7 * auVar109._24_4_ | (uint)!bVar7 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(bVar27 >> 7) * auVar109._28_4_ |
           (uint)!(bool)(bVar27 >> 7) * *(int *)(ray + 0x11c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }